

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

bstring bmidstr(const_bstring b,int left,int len)

{
  bstring ptVar1;
  uint uVar2;
  int len_00;
  int iVar3;
  
  if (((b == (const_bstring)0x0) || (b->slen < 0)) || (b->data == (uchar *)0x0)) {
    return (bstring)0x0;
  }
  uVar2 = 0;
  if (0 < left) {
    uVar2 = left;
  }
  iVar3 = 0;
  if (left < 0) {
    iVar3 = left;
  }
  len_00 = b->slen - uVar2;
  if (iVar3 + len < len_00) {
    len_00 = iVar3 + len;
  }
  if (0 < len_00) {
    ptVar1 = blk2bstr(b->data + uVar2,len_00);
    return ptVar1;
  }
  ptVar1 = bfromcstr(anon_var_dwarf_2abd1 + 0x10);
  return ptVar1;
}

Assistant:

bstring bmidstr (const_bstring b, int left, int len) {

	if (b == NULL || b->slen < 0 || b->data == NULL) return NULL;

	if (left < 0) {
		len += left;
		left = 0;
	}

	if (len > b->slen - left) len = b->slen - left;

	if (len <= 0) return bfromcstr ("");
	return blk2bstr (b->data + left, len);
}